

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void __thiscall
MutableBuffer::MutableBuffer(MutableBuffer *this,size_t _reserved,EndianessMode _endianess)

{
  uint8_t *puVar1;
  
  (this->super_Buffer).super_enable_shared_from_this<Buffer>._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Buffer).super_enable_shared_from_this<Buffer>._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Buffer).data = (void *)0x0;
  (this->super_Buffer).parent.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Buffer).parent.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Buffer).read = (uint8_t *)0x0;
  (this->super_Buffer).endianess = _endianess;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__MutableBuffer_00157b60;
  this->reserved = _reserved;
  this->growth = 1000;
  if (_reserved != 0) {
    puVar1 = (uint8_t *)malloc(_reserved);
    (this->super_Buffer).data = puVar1;
    (this->super_Buffer).read = puVar1;
  }
  (this->super_Buffer).size = 0;
  (this->super_Buffer).owned = true;
  return;
}

Assistant:

MutableBuffer::MutableBuffer(size_t _reserved, EndianessMode _endianess)
  : Buffer(_endianess)
  , reserved(_reserved)
  , growth(1000) {
  if (reserved > 0) {
    data = ::malloc(reserved);
    read = reinterpret_cast<uint8_t*>(data);
  }
  size = 0;
  owned = true;
}